

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall QMakeEvaluator::visitProBlock(QMakeEvaluator *this,ushort *tokPtr)

{
  ProValueMapStack *__x;
  uint *puVar1;
  ushort tok;
  ProFile *this_00;
  byte bVar2;
  VisitReturn VVar3;
  storage_type *psVar4;
  char16_t *pcVar5;
  char *pcVar6;
  QMakeEvaluator *this_01;
  uint uVar7;
  char *fmt;
  __off64_t *in_R8;
  size_t in_R9;
  byte bVar8;
  byte bVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QStringView config;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QMakeEvaluator *pQVar13;
  QStringView local_b0;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  int local_70;
  int local_6c;
  QArrayDataPointer<ProString> local_58;
  uint *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_debugLevel != 0) {
    traceMsgInternal(this,"entering block");
  }
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (ProString *)0x0;
  this_00 = (this->m_current).pro;
  __x = &this->m_valuemapStack;
  bVar9 = 1;
  bVar2 = 0;
  bVar8 = 0;
  pQVar13 = this;
LAB_001f63eb:
  do {
    this_01 = pQVar13;
    local_40 = (uint *)((long)tokPtr + 2);
    tok = (ushort)*(uint *)tokPtr;
    pcVar6 = "break";
    VVar3 = ReturnBreak;
    pQVar13 = this_01;
    switch(tok) {
    case 0:
      if (this_01->m_debugLevel != 0) {
        pcVar6 = "false";
        if (bVar9 != 0) {
          pcVar6 = "true";
        }
        traceMsgInternal(this_01,"leaving block, okey=%s",pcVar6);
      }
      VVar3 = (VisitReturn)bVar9;
      goto LAB_001f6df8;
    case 1:
      (this_01->m_current).line = *(ushort *)((long)tokPtr + 2);
      tokPtr = (ushort *)((long)tokPtr + 4);
      goto LAB_001f63eb;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
      VVar3 = visitProVariable(this_01,tok,(ProStringList *)&local_58,(ushort **)&local_40);
      if (VVar3 == ReturnError) {
        VVar3 = ReturnError;
        goto LAB_001f6da8;
      }
      QList<ProString>::clear((QList<ProString> *)&local_58);
      tokPtr = (ushort *)local_40;
      goto LAB_001f63eb;
    default:
      local_40 = (uint *)tokPtr;
      VVar3 = evaluateExpression(this_01,(ushort **)&local_40,(ProStringList *)&local_58,false);
      if ((VVar3 != ReturnError) &&
         (bVar10 = local_40 == (uint *)tokPtr, tokPtr = (ushort *)local_40, bVar10))
      goto LAB_001f63eb;
      break;
    case 0x10:
      if (bVar8 == bVar9) {
        if (this_01->m_debugLevel != 0) {
          if (local_58.size == 1) {
            formatValue((QString *)&local_a0,local_58.ptr,true);
            QString::toLocal8Bit((QByteArray *)&local_88,(QString *)&local_a0);
            pcVar5 = local_88.ptr;
            if (local_88.ptr == (char16_t *)0x0) {
              pcVar5 = (char16_t *)&QByteArray::_empty;
            }
            pcVar6 = "skipped condition %s";
            goto LAB_001f678a;
          }
          pcVar6 = "skipped condition %s";
LAB_001f6d71:
          traceMsgInternal(this_01,pcVar6,"<invalid>");
        }
      }
      else {
        if (local_58.size == 1) {
          local_88.ptr = ((local_58.ptr)->m_string).d.ptr;
          local_88.d = (Data *)((local_58.ptr)->m_string).d.size;
          config = QStringView::mid((QStringView *)&local_88,(long)(local_58.ptr)->m_offset,
                                    (long)(local_58.ptr)->m_length);
          bVar10 = isActiveConfig(this_01,config,true);
          if (this_01->m_debugLevel != 0) {
            formatValue((QString *)&local_a0,local_58.ptr,true);
            QString::toLocal8Bit((QByteArray *)&local_88,(QString *)&local_a0);
            pcVar5 = local_88.ptr;
            if (local_88.ptr == (char16_t *)0x0) {
              pcVar5 = (char16_t *)&QByteArray::_empty;
            }
            traceMsgInternal(this_01,"condition %s is %s",pcVar5);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          }
          goto LAB_001f6c89;
        }
        psVar4 = (storage_type *)
                 QByteArrayView::lengthHelperCharArray
                           ("Conditional must expand to exactly one word.",0x2d);
        QVar12.m_data = psVar4;
        QVar12.m_size = (qsizetype)&local_88;
        QString::fromLatin1(QVar12);
        evalError(this_01,(QString *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_001f6d56:
        bVar9 = 0;
      }
      goto LAB_001f6d7f;
    case 0x11:
      if (bVar8 == bVar9) {
        skipExpression(this_01,(ushort **)&local_40);
        if (this_01->m_debugLevel != 0) {
          if (local_58.size != 1) {
            pcVar6 = "skipped test function %s";
            goto LAB_001f6d71;
          }
          formatValue((QString *)&local_a0,local_58.ptr,true);
          QString::toLocal8Bit((QByteArray *)&local_88,(QString *)&local_a0);
          pcVar5 = local_88.ptr;
          if (local_88.ptr == (char16_t *)0x0) {
            pcVar5 = (char16_t *)&QByteArray::_empty;
          }
          pcVar6 = "skipped test function %s";
LAB_001f678a:
          traceMsgInternal(this_01,pcVar6,pcVar5);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        }
      }
      else {
        if (local_58.size != 1) {
          psVar4 = (storage_type *)
                   QByteArrayView::lengthHelperCharArray
                             ("Test name must expand to exactly one word.",0x2b);
          QVar11.m_data = psVar4;
          QVar11.m_size = (qsizetype)&local_88;
          QString::fromLatin1(QVar11);
          evalError(this_01,(QString *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          skipExpression(this_01,(ushort **)&local_40);
          goto LAB_001f6d56;
        }
        if (this_01->m_debugLevel != 0) {
          formatValue((QString *)&local_a0,local_58.ptr,true);
          QString::toLocal8Bit((QByteArray *)&local_88,(QString *)&local_a0);
          pcVar5 = local_88.ptr;
          if (local_88.ptr == (char16_t *)0x0) {
            pcVar5 = (char16_t *)&QByteArray::_empty;
          }
          traceMsgInternal(this_01,"evaluating test function %s",pcVar5);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        }
        VVar3 = evaluateConditionalFunction(this_01,(ProKey *)local_58.ptr,(ushort **)&local_40);
        bVar10 = true;
        if (VVar3 != ReturnTrue) {
          if (VVar3 != ReturnFalse) {
            if (this_01->m_debugLevel == 0) goto LAB_001f6df8;
            if (VVar3 - ReturnError < 3) {
              pcVar6 = (&PTR_anon_var_dwarf_46ae26_00269e60)[VVar3 - ReturnError];
            }
            else {
              pcVar6 = "<invalid>";
              if (VVar3 == ReturnReturn) {
                pcVar6 = "return";
              }
            }
            fmt = "aborting block, function status: %s";
            goto LAB_001f6df1;
          }
          bVar10 = false;
        }
        if (this_01->m_debugLevel != 0) {
          pcVar6 = "false";
          if (bVar10 != false) {
            pcVar6 = "true";
          }
          traceMsgInternal(this_01,"test function returned %s",pcVar6);
        }
LAB_001f6c89:
        bVar9 = bVar10 ^ bVar2;
      }
LAB_001f6d7f:
      bVar8 = bVar9 ^ 1;
      QList<ProString>::clear((QList<ProString> *)&local_58);
      bVar2 = 0;
      tokPtr = (ushort *)local_40;
      goto LAB_001f63eb;
    case 0x12:
      QArrayDataPointer<ProString>::operator=
                ((QArrayDataPointer<ProString> *)&this->m_returnValue,&local_58);
      QList<ProString>::clear((QList<ProString> *)&local_58);
      pcVar6 = "return";
      VVar3 = ReturnReturn;
    case 0x13:
      goto switchD_001f6423_caseD_13;
    case 0x14:
      pcVar6 = "next";
      VVar3 = ReturnNext;
switchD_001f6423_caseD_13:
      if (bVar9 != bVar8) {
        if (this_01->m_debugLevel == 0) goto LAB_001f6df8;
        fmt = "flow control statement \'%s\', aborting block";
        goto LAB_001f6df1;
      }
      bVar8 = 1;
      bVar9 = 0;
      tokPtr = (ushort *)local_40;
      pQVar13 = this_01;
      if (this_01->m_debugLevel != 0) {
        traceMsgInternal(this_01,"skipped flow control statement \'%s\'",pcVar6);
        tokPtr = (ushort *)local_40;
        pQVar13 = this_01;
      }
      goto LAB_001f63eb;
    case 0x15:
      if (this_01->m_debugLevel != 0) {
        traceMsgInternal(this_01,"NOT","break");
      }
      bVar2 = bVar2 ^ 1;
      tokPtr = (ushort *)local_40;
      pQVar13 = this_01;
      goto LAB_001f63eb;
    case 0x16:
      if (this_01->m_debugLevel == 0) goto LAB_001f667d;
      bVar8 = 0;
      pcVar6 = "AND";
      goto LAB_001f6a50;
    case 0x17:
      bVar8 = 1;
      tokPtr = (ushort *)local_40;
      if (this_01->m_debugLevel != 0) {
        pcVar6 = "OR";
LAB_001f6a50:
        traceMsgInternal(this_01,pcVar6,"break");
        tokPtr = (ushort *)local_40;
        pQVar13 = this_01;
      }
      goto LAB_001f63eb;
    case 0x18:
      local_40 = (uint *)((long)tokPtr + 6);
      uVar7 = *(uint *)((long)tokPtr + 2);
      VVar3 = 0xaaaaaaaa;
      if (bVar9 != 0) {
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"taking \'then\' branch","break");
        }
        VVar3 = ReturnTrue;
        if (uVar7 != 0) {
          VVar3 = visitProBlock(this_01,(ushort *)local_40);
        }
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"finished \'then\' branch");
        }
      }
      puVar1 = (uint *)((long)local_40 + (ulong)uVar7 * 2);
      local_40 = puVar1 + 1;
      uVar7 = *puVar1;
      if (bVar9 == 0) {
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"taking \'else\' branch");
        }
        VVar3 = ReturnTrue;
        if (uVar7 != 0) {
          VVar3 = visitProBlock(this_01,(ushort *)local_40);
        }
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"finished \'else\' branch");
        }
      }
      goto LAB_001f6cbc;
    case 0x19:
      if (bVar9 == bVar8) {
        local_40 = (uint *)((long)tokPtr +
                           (ulong)*(uint *)((long)tokPtr +
                                           (ulong)*(ushort *)((long)tokPtr + 6) * 2 + 8) * 2 +
                           (ulong)*(ushort *)((long)tokPtr + 6) * 2 + 0x10);
        uVar7 = local_40[-1];
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"skipped loop","break");
        }
        VVar3 = ReturnTrue;
      }
      else {
        ProFile::getHashStr((ProKey *)&local_88,this_00,(ushort **)&local_40);
        puVar1 = local_40 + 1;
        uVar7 = *(uint *)((long)local_40 + (ulong)*local_40 * 2 + 4);
        local_40 = (uint *)((long)local_40 + (ulong)*local_40 * 2 + 8);
        VVar3 = visitProLoop(this_01,(ProKey *)&local_88,(ushort *)puVar1,(ushort *)local_40);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      local_40 = (uint *)((long)local_40 + (ulong)uVar7 * 2);
      bVar9 = 1;
      bVar8 = 0;
      pQVar13 = this_01;
      break;
    case 0x1a:
    case 0x1b:
      if (bVar9 == bVar8) {
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"skipped function definition","break");
        }
        uVar7 = *(uint *)((long)local_40 + (ulong)(ushort)local_40[1] * 2 + 6);
        local_40 = (uint *)((long)local_40 + (ulong)(ushort)local_40[1] * 2 + 10);
        pQVar13 = this_01;
      }
      else {
        ProFile::getHashStr((ProKey *)&local_88,this_00,(ushort **)&local_40);
        uVar7 = *local_40;
        local_40 = local_40 + 1;
        pQVar13 = this_01;
        visitProFunctionDef(this_01,tok,(ProKey *)&local_88,(ushort *)local_40);
        if (this_01->m_debugLevel != 0) {
          pcVar6 = "test";
          if (tok != 0x1a) {
            pcVar6 = "replace";
          }
          local_a0.d = (Data *)local_88.size;
          local_a0.ptr = local_88.ptr;
          local_b0 = QStringView::mid((QStringView *)&local_a0,(long)local_70,(long)local_6c);
          QStringView::toLocal8Bit((QByteArray *)&local_a0,&local_b0);
          pcVar5 = local_a0.ptr;
          if (local_a0.ptr == (char16_t *)0x0) {
            pcVar5 = (char16_t *)&QByteArray::_empty;
          }
          traceMsgInternal(pQVar13,"defined %s function %s",pcVar6,pcVar5);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a0);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      local_40 = (uint *)((long)local_40 + (ulong)uVar7 * 2);
      bVar9 = 1;
      this_01 = pQVar13;
LAB_001f667d:
      bVar8 = 0;
      tokPtr = (ushort *)local_40;
      pQVar13 = this_01;
      goto LAB_001f63eb;
    case 0x1c:
      local_40 = (uint *)((long)tokPtr + 6);
      uVar7 = *(uint *)((long)tokPtr + 2);
      if ((bVar9 == bVar8) || (uVar7 == 0)) {
        VVar3 = ReturnTrue;
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"skipped nesting-bypassing block","break");
          VVar3 = ReturnTrue;
        }
      }
      else {
        local_88.size = -0x5555555555555556;
        local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        std::__detail::_List_node_header::_List_node_header
                  ((_List_node_header *)&local_88,(_List_node_header *)__x);
        std::__cxx11::
        list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::clear
                  (&__x->
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  );
        std::__cxx11::
        list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::splice
                  (&__x->
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   ,(int)__x,(__off64_t *)&local_88,(int)local_88.d,in_R8,in_R9,(uint)this_01);
        pQVar13 = this_01;
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"visiting nesting-bypassing block");
        }
        VVar3 = visitProBlock(this_01,(ushort *)local_40);
        if (this_01->m_debugLevel != 0) {
          traceMsgInternal(this_01,"visited nesting-bypassing block");
        }
        std::__cxx11::
        list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::splice
                  ((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    *)&local_88,(int)local_88.d,(__off64_t *)__x,
                   (int)(__x->
                        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                        ).
                        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,in_R8,in_R9,(uint)pQVar13);
        std::__cxx11::
        list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
        _M_move_assign(&__x->
                        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ,&local_88);
        std::__cxx11::
        _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
        _M_clear((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  *)&local_88);
      }
LAB_001f6cbc:
      local_40 = (uint *)((long)local_40 + (ulong)uVar7 * 2);
      bVar9 = 1;
      bVar8 = 0;
    }
    tokPtr = (ushort *)local_40;
    if (ReturnTrue < VVar3) {
LAB_001f6da8:
      if (this_01->m_debugLevel != 0) {
        if (VVar3 - ReturnError < 3) {
          pcVar6 = (&PTR_anon_var_dwarf_46ae26_00269e60)[VVar3 - ReturnError];
        }
        else {
          pcVar6 = "<invalid>";
          if (VVar3 == ReturnReturn) {
            pcVar6 = "return";
          }
        }
        fmt = "aborting block, status: %s";
LAB_001f6df1:
        traceMsgInternal(this_01,fmt,pcVar6);
      }
LAB_001f6df8:
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return VVar3;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProBlock(
        const ushort *tokPtr)
{
    traceMsg("entering block");
    ProStringList curr;
    ProFile *pro = m_current.pro;
    bool okey = true, or_op = false, invert = false;
    uint blockLen;
    while (ushort tok = *tokPtr++) {
        VisitReturn ret;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            continue;
        case TokAssign:
        case TokAppend:
        case TokAppendUnique:
        case TokRemove:
        case TokReplace:
            ret = visitProVariable(tok, curr, tokPtr);
            if (ret == ReturnError)
                break;
            curr.clear();
            continue;
        case TokBranch:
            blockLen = getBlockLen(tokPtr);
            if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                if (!okey)
                    m_skipLevel++;
                ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey)
                    m_skipLevel--;
                else
                    m_skipLevel++;
                if ((ret == ReturnTrue || ret == ReturnFalse) && blockLen)
                    ret = visitProBlock(tokPtr);
                if (okey)
                    m_skipLevel--;
#endif
            } else {
                if (okey) {
                    traceMsg("taking 'then' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'then' branch");
                }
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey) {
                    traceMsg("taking 'else' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'else' branch");
                }
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokForLoop:
            if (m_cumulative || okey != or_op) {
                const ProKey &variable = pro->getHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                const ushort *exprPtr = tokPtr;
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                ret = visitProLoop(variable, exprPtr, tokPtr);
            } else {
                skipHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                traceMsg("skipped loop");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokBypassNesting:
            blockLen = getBlockLen(tokPtr);
            if ((m_cumulative || okey != or_op) && blockLen) {
                ProValueMapStack savedValuemapStack = std::move(m_valuemapStack);
                m_valuemapStack.clear();
                m_valuemapStack.splice(m_valuemapStack.end(),
                                       savedValuemapStack, savedValuemapStack.begin());
                traceMsg("visiting nesting-bypassing block");
                ret = visitProBlock(tokPtr);
                traceMsg("visited nesting-bypassing block");
                savedValuemapStack.splice(savedValuemapStack.begin(),
                                          m_valuemapStack, m_valuemapStack.begin());
                m_valuemapStack = std::move(savedValuemapStack);
            } else {
                traceMsg("skipped nesting-bypassing block");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokTestDef:
        case TokReplaceDef:
            if (m_cumulative || okey != or_op) {
                const ProKey &name = pro->getHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
                visitProFunctionDef(tok, name, tokPtr);
                traceMsg("defined %s function %s",
                      tok == TokTestDef ? "test" : "replace", dbgKey(name));
            } else {
                traceMsg("skipped function definition");
                skipHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            continue;
        case TokNot:
            traceMsg("NOT");
            invert ^= true;
            continue;
        case TokAnd:
            traceMsg("AND");
            or_op = false;
            continue;
        case TokOr:
            traceMsg("OR");
            or_op = true;
            continue;
        case TokCondition:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Conditional must expand to exactly one word."));
                    okey = false;
                } else {
                    okey = isActiveConfig(curr.at(0).toQStringView(), true);
                    traceMsg("condition %s is %s", dbgStr(curr.at(0)), dbgBool(okey));
                    okey ^= invert;
                }
            } else {
                traceMsg("skipped condition %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokTestCall:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Test name must expand to exactly one word."));
                    skipExpression(tokPtr);
                    okey = false;
                } else {
                    traceMsg("evaluating test function %s", dbgStr(curr.at(0)));
                    ret = evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                    switch (ret) {
                    case ReturnTrue: okey = true; break;
                    case ReturnFalse: okey = false; break;
                    default:
                        traceMsg("aborting block, function status: %s", dbgReturn(ret));
                        return ret;
                    }
                    traceMsg("test function returned %s", dbgBool(okey));
                    okey ^= invert;
                }
            } else if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                m_skipLevel++;
                if (curr.size() != 1)
                    skipExpression(tokPtr);
                else
                    evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                m_skipLevel--;
#endif
            } else {
                skipExpression(tokPtr);
                traceMsg("skipped test function %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokReturn:
            m_returnValue = curr;
            curr.clear();
            ret = ReturnReturn;
            goto ctrlstm;
        case TokBreak:
            ret = ReturnBreak;
            goto ctrlstm;
        case TokNext:
            ret = ReturnNext;
          ctrlstm:
            if (!m_skipLevel && okey != or_op) {
                traceMsg("flow control statement '%s', aborting block", dbgReturn(ret));
                return ret;
            }
            traceMsg("skipped flow control statement '%s'", dbgReturn(ret));
            okey = false, or_op = true; // force next evaluation
            continue;
        default: {
                const ushort *oTokPtr = --tokPtr;
                ret = evaluateExpression(tokPtr, &curr, false);
                if (ret == ReturnError || tokPtr != oTokPtr)
                    break;
            }
            Q_ASSERT_X(false, "visitProBlock", "unexpected item type");
            continue;
        }
        if (ret != ReturnTrue && ret != ReturnFalse) {
            traceMsg("aborting block, status: %s", dbgReturn(ret));
            return ret;
        }
    }
    traceMsg("leaving block, okey=%s", dbgBool(okey));
    return returnBool(okey);
}